

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fASTCDecompressionCases.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D::render
          (ASTCRenderer2D *this,Surface *referenceDst,Surface *resultDst,Texture2D *texture,
          TextureFormat *uncompressedFormat)

{
  int preferredHeight;
  RenderContext *context;
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  void *data;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  RandomViewport local_148;
  vector<float,_std::allocator<float>_> local_138;
  Surface *local_120;
  Surface *local_118;
  RenderContext *local_110;
  TextureFormat *local_108;
  Texture2DView local_100;
  PixelBufferAccess local_f0;
  ReferenceParams local_c4;
  long lVar4;
  
  local_120 = resultDst;
  local_118 = referenceDst;
  local_108 = uncompressedFormat;
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  local_110 = this->m_context->m_renderCtx;
  iVar1 = (texture->m_refTexture).m_width;
  preferredHeight = (texture->m_refTexture).m_height;
  iVar2 = (*local_110->_vptr_RenderContext[4])();
  dVar3 = deRandom_getUint32(&(this->m_rnd).m_rnd);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_148,(RenderTarget *)CONCAT44(extraout_var_00,iVar2),iVar1,preferredHeight,dVar3)
  ;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_c4,TEXTURETYPE_2D);
  local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f0.super_ConstPixelBufferAccess.m_format.order = R;
  local_f0.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  local_100.m_numLevels = 0x3f800000;
  local_100._4_4_ = 0x3f800000;
  glu::TextureTestUtil::computeQuadTexCoord2D(&local_138,(Vec2 *)&local_f0,(Vec2 *)&local_100);
  local_c4.super_RenderParams.samplerType = glu::TextureTestUtil::getSamplerType(*local_108);
  local_c4.sampler.wrapS = CLAMP_TO_EDGE;
  local_c4.sampler.wrapT = CLAMP_TO_EDGE;
  local_c4.sampler.wrapR = CLAMP_TO_EDGE;
  local_c4.sampler.minFilter = NEAREST;
  local_c4.sampler.magFilter = NEAREST;
  local_c4.sampler.lodThreshold = 0.0;
  local_c4.sampler.normalizedCoords = true;
  local_c4.sampler.compare = COMPAREMODE_NONE;
  local_c4.sampler.compareChannel = 0;
  local_c4.sampler.borderColor.v._0_8_ = 0;
  local_c4.sampler.borderColor.v._8_8_ = 0;
  local_c4.sampler.seamlessCubeMap = false;
  local_c4.sampler._53_3_ = 0;
  local_c4.sampler.depthStencilMode = MODE_DEPTH;
  local_c4.super_RenderParams.colorScale.m_data._0_8_ = *(undefined8 *)(this->m_colorScale).m_data;
  local_c4.super_RenderParams.colorScale.m_data._8_8_ =
       *(undefined8 *)((this->m_colorScale).m_data + 2);
  local_c4.super_RenderParams.colorBias.m_data[0] = (this->m_colorBias).m_data[0];
  local_c4.super_RenderParams.colorBias.m_data[1] = (this->m_colorBias).m_data[1];
  local_c4.super_RenderParams.colorBias.m_data[2] = (this->m_colorBias).m_data[2];
  local_c4.super_RenderParams.colorBias.m_data[3] = (this->m_colorBias).m_data[3];
  (**(code **)(lVar4 + 0x1a00))(local_148.x,local_148.y,local_148.width,local_148.height);
  (**(code **)(lVar4 + 8))(0x84c0);
  (**(code **)(lVar4 + 0xb8))(0xde1,texture->m_glTexture);
  (**(code **)(lVar4 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar4 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar4 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar4 + 0x1360))(0xde1,0x2800,0x2600);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fASTCDecompressionCases.cpp"
                  ,0x164);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,
             local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_c4.super_RenderParams);
  (**(code **)(lVar4 + 0x650))();
  context = local_110;
  iVar1 = (*local_110->_vptr_RenderContext[4])(local_110);
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)&local_f0,local_118,
             (PixelFormat *)(CONCAT44(extraout_var_01,iVar1) + 8));
  local_100.m_levels = (texture->m_refTexture).m_view.m_levels;
  local_100.m_numLevels = (texture->m_refTexture).m_view.m_numLevels;
  glu::TextureTestUtil::sampleTexture
            ((SurfaceAccess *)&local_f0,&local_100,
             local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_c4);
  local_100.m_numLevels = 8;
  local_100._4_4_ = 3;
  data = (void *)(local_120->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (local_120->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_f0,(TextureFormat *)&local_100,local_120->m_width,local_120->m_height,1,data);
  glu::readPixels(context,local_148.x,local_148.y,&local_f0);
  if (local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ASTCRenderer2D::render (Surface& referenceDst, Surface& resultDst, const glu::Texture2D& texture, const tcu::TextureFormat& uncompressedFormat)
{
	DE_ASSERT(m_initialized);

	const glw::Functions&			gl						= m_context.getRenderContext().getFunctions();
	const glu::RenderContext&		renderCtx				= m_context.getRenderContext();
	const int						textureWidth			= texture.getRefTexture().getWidth();
	const int						textureHeight			= texture.getRefTexture().getHeight();
	const RandomViewport			viewport				(renderCtx.getRenderTarget(), textureWidth, textureHeight, m_rnd.getUint32());
	ReferenceParams					renderParams			(TEXTURETYPE_2D);
	vector<float>					texCoord;
	computeQuadTexCoord2D(texCoord, Vec2(0.0f, 0.0f), Vec2(1.0f, 1.0f));

	renderParams.samplerType	= getSamplerType(uncompressedFormat);
	renderParams.sampler		= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	renderParams.colorScale		= m_colorScale;
	renderParams.colorBias		= m_colorBias;

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, texture.getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Issue GL draws.
	m_renderer.renderQuad(0, &texCoord[0], renderParams);
	gl.flush();

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceDst, renderCtx.getRenderTarget().getPixelFormat()), texture.getRefTexture(), &texCoord[0], renderParams);

	// Read GL-rendered image.
	glu::readPixels(renderCtx, viewport.x, viewport.y, resultDst.getAccess());
}